

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<int> * __thiscall
kj::ArrayBuilder<int>::operator=(ArrayBuilder<int> *this,ArrayBuilder<int> *other)

{
  int *piVar1;
  RemoveConst<int> *pRVar2;
  int *piVar3;
  
  piVar1 = this->ptr;
  if (piVar1 != (int *)0x0) {
    pRVar2 = this->pos;
    piVar3 = this->endPtr;
    this->ptr = (int *)0x0;
    this->pos = (RemoveConst<int> *)0x0;
    this->endPtr = (int *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,piVar1,4,(long)pRVar2 - (long)piVar1 >> 2,
               (long)piVar3 - (long)piVar1 >> 2,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (int *)0x0;
  other->pos = (RemoveConst<int> *)0x0;
  other->endPtr = (int *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }